

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O0

bool __thiscall
tinyusdz::ascii::AsciiParser::ReadBasicType
          (AsciiParser *this,optional<std::array<unsigned_int,_4UL>_> *value)

{
  bool bVar1;
  undefined1 local_34 [8];
  uint4 v;
  optional<std::array<unsigned_int,_4UL>_> *value_local;
  AsciiParser *this_local;
  
  unique0x10000064 = value;
  bVar1 = MaybeNone(this);
  if (bVar1) {
    nonstd::optional_lite::optional<std::array<unsigned_int,_4UL>_>::operator=
              (stack0xffffffffffffffe0);
    this_local._7_1_ = true;
  }
  else {
    bVar1 = ReadBasicType(this,(uint4 *)local_34);
    if (bVar1) {
      nonstd::optional_lite::optional<std::array<unsigned_int,4ul>>::operator=
                ((optional<std::array<unsigned_int,4ul>> *)stack0xffffffffffffffe0,
                 (array<unsigned_int,_4UL> *)local_34);
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool AsciiParser::ReadBasicType(nonstd::optional<value::uint4> *value) {
  if (MaybeNone()) {
    (*value) = nonstd::nullopt;
    return true;
  }

  value::uint4 v;
  if (ReadBasicType(&v)) {
    (*value) = v;
    return true;
  }

  return false;
}